

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_gnutar.c
# Opt level: O0

int format_256(int64_t v,char *p,int s)

{
  int s_local;
  char *p_local;
  int64_t v_local;
  
  s_local = s;
  p_local = p + s;
  v_local = v;
  while (0 < s_local) {
    p_local[-1] = (char)v_local;
    v_local = v_local >> 8;
    s_local = s_local + -1;
    p_local = p_local + -1;
  }
  *p_local = *p_local | 0x80;
  return 0;
}

Assistant:

static int
format_256(int64_t v, char *p, int s)
{
	p += s;
	while (s-- > 0) {
		*--p = (char)(v & 0xff);
		v >>= 8;
	}
	*p |= 0x80; /* Set the base-256 marker bit. */
	return (0);
}